

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void __thiscall
duckdb::Executor::Initialize
          (Executor *this,
          unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>
          *physical_plan_p)

{
  _Head_base<0UL,_duckdb::PhysicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PhysicalOperator_*,_false> _Var2;
  type plan;
  
  Reset(this);
  _Var1._M_head_impl =
       (physical_plan_p->
       super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
       .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl;
  (physical_plan_p->
  super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
  .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl = (PhysicalOperator *)0x0;
  _Var2._M_head_impl =
       (this->owned_plan).
       super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
       .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl;
  (this->owned_plan).
  super_unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
  .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (PhysicalOperator *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_PhysicalOperator + 8))();
  }
  plan = unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>::
         operator*(&this->owned_plan);
  InitializeInternal(this,plan);
  return;
}

Assistant:

void Executor::Initialize(unique_ptr<PhysicalOperator> physical_plan_p) {
	Reset();
	owned_plan = std::move(physical_plan_p);
	InitializeInternal(*owned_plan);
}